

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall chrono::fea::ChExtruderBeamEuler::Update(ChExtruderBeamEuler *this)

{
  ChCoordsys<double> *this_00;
  ChQuaternion<double> *pCVar1;
  double dVar2;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ChMesh *pCVar5;
  element_type *peVar6;
  element_type *peVar7;
  ChLinkMotorLinearSpeed *this_02;
  ChContactSurfaceNodeCloud *this_03;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ChNodeFEAxyzrot *this_04;
  ChCoordsys<double> *mc;
  undefined1 auVar9 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> node0;
  shared_ptr<chrono::fea::ChElementBeamEuler> element;
  ChVector<double> v;
  value_type local_428;
  element_type *local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_410;
  ChBodyFrame *local_408;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_400;
  undefined1 *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_3e8;
  ChNodeFEAxyzrot *local_3d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3d0;
  shared_ptr<chrono::fea::ChElementBase> local_3c8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_3b8;
  element_type *local_3a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  shared_ptr<chrono::ChFunction> local_398;
  ChFrame<double> local_388;
  ChCoordsys<double> local_2f8;
  undefined1 local_2b8 [16];
  double local_2a8;
  double local_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  ChFrame<double> local_278;
  ChVector<double> local_1e8;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  psVar3 = (this->beam_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar4 = psVar3[-1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_01 = psVar3[-1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_1e8.m_data[0] = *(double *)&(peVar4->super_ChNodeFEAbase).field_0x20;
  local_1e8.m_data[1] = *(double *)&peVar4->field_0x28;
  this_00 = &this->outlet;
  local_1e8.m_data[2] = *(double *)&peVar4->field_0x30;
  ChCoordsys<double>::TransformParentToLocal(this_00,&local_1e8);
  if (0.0 <= (double)local_388._vptr_ChFrame) {
    local_278.coord.pos.m_data[1] = (double)local_388._vptr_ChFrame - this->h;
    local_2f8.pos.m_data[2] = 0.0;
    local_2f8.pos.m_data[0] = 0.0;
    local_2f8.pos.m_data[1] = 0.0;
    local_2f8.rot.m_data[0] = 1.0;
    local_2f8.rot.m_data[3] = 0.0;
    pCVar1 = &(this->outlet).rot;
    local_2f8.rot.m_data[1] = 0.0;
    local_2f8.rot.m_data[2] = 0.0;
    if (pCVar1 != &local_2f8.rot) {
      local_2f8.rot.m_data[0] = pCVar1->m_data[0];
      local_2f8.rot.m_data[1] = (this->outlet).rot.m_data[1];
      local_2f8.rot.m_data[2] = (this->outlet).rot.m_data[2];
      local_2f8.rot.m_data[3] = (this->outlet).rot.m_data[3];
    }
    local_278._vptr_ChFrame = (_func_int **)(local_278.coord.pos.m_data[1] * VECT_X);
    local_278.coord.pos.m_data[0] = local_278.coord.pos.m_data[1] * DAT_00b689b8;
    local_278.coord.pos.m_data[1] = local_278.coord.pos.m_data[1] * DAT_00b689c0;
    ChCoordsys<double>::TransformLocalToParent(this_00,(ChVector<double> *)&local_278);
    pCVar1 = &(peVar4->X0).coord.rot;
    local_2f8.pos.m_data[0] = (this->outlet).pos.m_data[0] + (double)local_388._vptr_ChFrame;
    local_2f8.pos.m_data[1] = (this->outlet).pos.m_data[1] + local_388.coord.pos.m_data[0];
    local_2f8.pos.m_data[2] = (this->outlet).pos.m_data[2] + local_388.coord.pos.m_data[1];
    local_2a0 = 1.0;
    dStack_288 = 0.0;
    dStack_298 = 0.0;
    dStack_290 = 0.0;
    if (pCVar1 != (ChQuaternion<double> *)&local_2a0) {
      local_2a0 = pCVar1->m_data[0];
      dStack_298 = (peVar4->X0).coord.rot.m_data[1];
      dStack_290 = (peVar4->X0).coord.rot.m_data[2];
      dStack_288 = (peVar4->X0).coord.rot.m_data[3];
    }
    dVar2 = this->h;
    auVar9._0_8_ = dVar2 * VECT_X;
    auVar9._8_8_ = dVar2 * DAT_00b689b8;
    local_2b8 = vsubpd_avx(*(undefined1 (*) [16])(peVar4->X0).coord.pos.m_data,auVar9);
    local_2a8 = (peVar4->X0).coord.pos.m_data[2] - dVar2 * DAT_00b689c0;
    mc = &local_2f8;
    ChFrame<double>::ChFrame(&local_278,mc);
    this_04 = (ChNodeFEAxyzrot *)ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mc);
    local_388._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
    local_388.coord.pos.m_data[0] = local_278.coord.pos.m_data[0];
    local_388.coord.pos.m_data[1] = local_278.coord.pos.m_data[1];
    local_388.coord.pos.m_data[2] = local_278.coord.pos.m_data[2];
    local_388.coord.rot.m_data[0] = local_278.coord.rot.m_data[0];
    local_388.coord.rot.m_data[1] = local_278.coord.rot.m_data[1];
    local_388.coord.rot.m_data[2] = local_278.coord.rot.m_data[2];
    local_388.coord.rot.m_data[3] = local_278.coord.rot.m_data[3];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_388.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_278.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_04,&local_388);
    local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_04;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
              (&local_428.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this_04);
    peVar8 = local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_278.coord.pos.m_data[1] = this->speed;
    local_278._vptr_ChFrame = (_func_int **)(local_278.coord.pos.m_data[1] * VECT_X);
    local_278.coord.pos.m_data[0] = local_278.coord.pos.m_data[1] * DAT_00b689b8;
    local_278.coord.pos.m_data[1] = local_278.coord.pos.m_data[1] * DAT_00b689c0;
    ChCoordsys<double>::TransformDirectionLocalToParent(this_00,(ChVector<double> *)&local_278);
    (**(code **)(*(long *)&(peVar8->super_ChNodeFEAbase).field_0x18 + 0x38))
              (&(peVar8->super_ChNodeFEAbase).field_0x18,&local_388);
    peVar8 = local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ChFrame<double>::ChFrame(&local_b8,(ChCoordsys<double> *)local_2b8);
    ChFrame<double>::operator=(&peVar8->X0,&local_b8);
    pCVar5 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_3b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &(local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->super_ChNodeFEAbase;
    local_3b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChMesh::AddNode(pCVar5,&local_3b8);
    if (local_3b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3b8.
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(&this->beam_nodes,&local_428);
    peVar6 = (this->actuator).
             super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3f8 = &((local_428.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ChNodeFEAbase).field_0x18;
    if (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (ChNodeFEAxyzrot *)0x0) {
      local_3f8 = (undefined1 *)0x0;
    }
    local_3f0 = local_428.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    peVar7 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_408 = &peVar7->super_ChBodyFrame;
    if (peVar7 == (element_type *)0x0) {
      local_408 = (ChBodyFrame *)0x0;
    }
    local_400 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_400->_M_use_count = local_400->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_400->_M_use_count = local_400->_M_use_count + 1;
      }
    }
    ChFrame<double>::ChFrame(&local_140,&local_2f8);
    ChFrame<double>::ChFrame(&local_1c8,&local_2f8);
    (**(code **)(*(long *)&(peVar6->super_ChLinkMotorLinear).super_ChLinkMotor.
                           super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink + 0x248))
              (peVar6,&local_3f8,&local_408,0,&local_140,&local_1c8);
    if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400);
    }
    if (local_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0);
    }
    this_02 = (this->actuator).
              super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
    (local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = 1;
    (local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_weak_count = 1;
    local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    (local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
    dVar2 = this->speed;
    local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
    *(double *)
     &local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_use_count = dVar2;
    ChLinkMotorLinearSpeed::SetSpeedFunction(this_02,&local_398);
    if (local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_398.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    peVar6 = (this->actuator).
             super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(double *)&(peVar6->super_ChLinkMotorLinear).field_0x278 =
         *(double *)&(peVar6->super_ChLinkMotorLinear).field_0x278 - this->h;
    local_388._vptr_ChFrame = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::fea::ChElementBeamEuler,std::allocator<chrono::fea::ChElementBeamEuler>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_388.coord,
               (ChElementBeamEuler **)&local_388,
               (allocator<chrono::fea::ChElementBeamEuler> *)&local_278);
    pCVar5 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_3c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_388._vptr_ChFrame;
    local_3c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388.coord.pos.m_data[0];
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)((long)local_388.coord.pos.m_data[0] + 8) =
             *(_Atomic_word *)((long)local_388.coord.pos.m_data[0] + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)((long)local_388.coord.pos.m_data[0] + 8) =
             *(_Atomic_word *)((long)local_388.coord.pos.m_data[0] + 8) + 1;
      }
    }
    ChMesh::AddElement(pCVar5,&local_3c8);
    if (local_3c8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3c8.
                 super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
    ::push_back(&this->beam_elems,(value_type *)&local_388);
    local_3d8 = local_428.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Stack_3d0 = local_428.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    local_418 = peVar4;
    local_410 = this_01;
    (*(*(_func_int ***)local_388._vptr_ChFrame)[0x1a])
              (local_388._vptr_ChFrame,&local_3d8,&local_418);
    if (local_410 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410);
    }
    if (p_Stack_3d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3d0);
    }
    local_3a8 = (this->beam_section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    local_3a0._M_pi =
         (this->beam_section).
         super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      }
    }
    ((element_type *)(local_388._vptr_ChFrame + 0x1a))->_vptr_ChElementBase =
         (_func_int **)local_3a8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_388._vptr_ChFrame + 0x1b),
               &local_3a0);
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    (*(*(_func_int ***)local_388._vptr_ChFrame)[0x15])(local_388._vptr_ChFrame,this->mysystem);
    this_03 = (this->contactcloud).
              super___shared_ptr<chrono::fea::ChContactSurfaceNodeCloud,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (this_03 != (ChContactSurfaceNodeCloud *)0x0) {
      local_3e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      local_3e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_428.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_428.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChContactSurfaceNodeCloud::AddNode(this_03,&local_3e8,this->contact_radius);
      if (local_3e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3e8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388.coord.pos.m_data[0]);
    }
    if (local_428.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_428.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  this->mytime = this->mysystem->ch_time;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void ChExtruderBeamEuler::Update() {
    auto node1 = beam_nodes.back();
    ChVector<> P1 = node1->GetPos();
    double d1 = (outlet.TransformParentToLocal(P1)).x();

    // GetLog() << " d1=" << d1 << "\n";

    if (d1 >= 0) {
        double d0 = d1 - this->h;
        ChCoordsys<> C0;
        C0.rot = outlet.rot;
        C0.pos = outlet.pos + outlet.TransformLocalToParent(VECT_X * d0);
        ChCoordsys<> C0_ref;
        C0_ref.rot = node1->GetX0().GetRot();
        C0_ref.pos = node1->GetX0().GetPos() - VECT_X * this->h;

        auto node0 = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(C0));
        node0->SetPos_dt(outlet.TransformDirectionLocalToParent(VECT_X * this->speed));
        node0->SetX0(ChFrame<>(C0_ref));
        mesh->AddNode(node0);
        beam_nodes.push_back(node0);

        actuator->Initialize(node0, ground, false, ChFrame<>(C0), ChFrame<>(C0));
        actuator->SetSpeedFunction(chrono_types::make_shared<ChFunction_Const>(this->speed));
        actuator->SetMotionOffset(actuator->GetMotionOffset() - this->h);
        /*
        actuator->Initialize(node0, ground, false, ChFrame<>(C0), ChFrame<>(C0));
        actuator->SetMotionFunction(chrono_types::make_shared<ChFunction_Ramp>(0,this->speed));
        actuator->SetMotionOffset(actuator->GetMotionOffset() - this->h);
        */
        auto element = chrono_types::make_shared<ChElementBeamEuler>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(node0, node1);

        element->SetSection(this->beam_section);

        element->SetupInitial(mysystem);

        // add collision model to node
        if (this->contactcloud) {
            contactcloud->AddNode(node0, this->contact_radius);
        }
    }
    mytime = mysystem->GetChTime();
}